

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * __thiscall
cmSystemTools::HelpFileName_abi_cxx11_
          (string *__return_storage_ptr__,cmSystemTools *this,string_view str)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,str._M_len,this + str._M_len,str._M_str);
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,"<","");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,">","");
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::HelpFileName(cm::string_view str)
{
  std::string name(str);
  cmSystemTools::ReplaceString(name, "<", "");
  cmSystemTools::ReplaceString(name, ">", "");
  return name;
}